

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O3

CcsContext __thiscall ccs::CcsDomain::build(CcsDomain *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long *in_RSI;
  CcsContext CVar2;
  shared_ptr<const_ccs::Node> local_18;
  
  local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(*in_RSI + 8);
  local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RSI + 0x10);
  if (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CcsContext::CcsContext((CcsContext *)this,&local_18);
  _Var1._M_pi = extraout_RDX;
  if (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  CVar2.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  CVar2.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CcsContext)
         CVar2.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CcsContext CcsDomain::build() {
  return CcsContext(dag->root());
}